

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O3

void AssemblyCode::addNotOrientedEdge
               (string *a,string *b,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph)

{
  size_t __n;
  int iVar1;
  pointer pcVar2;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __n = a->_M_string_length;
  if (__n == b->_M_string_length) {
    if (__n != 0) {
      pcVar2 = (a->_M_dataplus)._M_p;
      iVar1 = bcmp(pcVar2,(b->_M_dataplus)._M_p,__n);
      if (iVar1 != 0) goto LAB_00153d44;
    }
    __assert_fail("a != b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/register_allocation/InterferentGraphBuilder.cpp"
                  ,0x15,
                  "void AssemblyCode::addNotOrientedEdge(std::string, std::string, std::map<std::string, std::set<std::string>> &)"
                 );
  }
  pcVar2 = (a->_M_dataplus)._M_p;
LAB_00153d44:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + __n);
  pcVar2 = (b->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar2,pcVar2 + b->_M_string_length)
  ;
  addOrientedEdge(&local_50,&local_70,graph);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar2 = (b->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar2,pcVar2 + b->_M_string_length)
  ;
  pcVar2 = (a->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,pcVar2,pcVar2 + a->_M_string_length)
  ;
  addOrientedEdge(&local_90,&local_b0,graph);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AssemblyCode::addNotOrientedEdge(std::string a, std::string b, std::map<std::string, std::set<std::string>>& graph) {
    assert(a != b);

    addOrientedEdge(a, b, graph);
    addOrientedEdge(b, a, graph);
}